

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_common.cpp
# Opt level: O1

int __thiscall pstore::brokerface::writer::writer(writer *this,UI *ui,UI_STRING *uis)

{
  _Manager_type p_Var1;
  bool bVar2;
  undefined7 extraout_var;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type p_Stack_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  p_Stack_10 = *(_Invoker_type *)(uis + 0x18);
  p_Var1 = *(_Manager_type *)(uis + 0x10);
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ = (undefined8)*(undefined8 *)uis;
    local_28._8_8_ = *(undefined8 *)(uis + 8);
    *(undefined8 *)(uis + 0x10) = 0;
    *(undefined8 *)(uis + 0x18) = 0;
    local_18 = p_Var1;
  }
  this->_vptr_writer = (_func_int **)&PTR__writer_0012e8e0;
  fifo_path::open_client_pipe((fifo_path *)&this->fd_);
  (this->retry_timeout_).__r = 0;
  this->max_retries_ = 0;
  *(undefined8 *)&(this->update_cb_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = 0;
  (this->update_cb_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->update_cb_)._M_invoker = p_Stack_10;
  if (local_18 != (_Manager_type)0x0) {
    *(void **)&(this->update_cb_).super__Function_base._M_functor = local_28._M_unused._M_object;
    *(undefined8 *)((long)&(this->update_cb_).super__Function_base._M_functor + 8) = local_28._8_8_;
    (this->update_cb_).super__Function_base._M_manager = local_18;
    local_18 = (_Manager_type)0x0;
    p_Stack_10 = (_Invoker_type)0x0;
  }
  if (local_18 != (_Manager_type)0x0) {
    bVar2 = (*local_18)(&local_28,&local_28,__destroy_functor);
    local_18 = (_Manager_type)CONCAT71(extraout_var,bVar2);
  }
  return (int)local_18;
}

Assistant:

writer::writer (fifo_path const & fifo, update_callback cb)
                : writer (fifo, duration_type{0}, 0U, std::move (cb)) {}